

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VelocityZ.cpp
# Opt level: O1

void __thiscall OpenMD::VelocityZ::process(VelocityZ *this)

{
  long *plVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  char cVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_01;
  pointer pvVar4;
  iterator __position;
  iterator __position_00;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  VelocityZ *pVVar11;
  SelectionManager *this_02;
  int iVar12;
  SelectionSet *pSVar13;
  ulong uVar14;
  uint i;
  double *__args;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  int ii;
  Vector3d pos;
  StuntDouble *sd;
  Mat3x3d hmat;
  DumpReader reader;
  int local_133c;
  SelectionSet local_1338;
  VelocityZ *local_1318;
  pointer local_1310;
  double local_1308;
  StuntDouble *local_1300;
  int local_12f4;
  vector<double,std::allocator<double>> *local_12f0;
  SelectionEvaluator *local_12e8;
  SelectionManager *local_12e0;
  ulong local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar12 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar12 / (this->super_StaticAnalyser).step_;
  if (0 < iVar12) {
    local_12f0 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_12e8 = &this->evaluator_;
    local_12e0 = &this->seleMan_;
    uVar21 = 0;
    local_1318 = this;
    local_12f4 = iVar12;
    do {
      this_02 = local_12e0;
      pVVar11 = local_1318;
      DumpReader::readFrame(&local_1288,(int)uVar21);
      this_01 = ((pVVar11->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      pVVar11->currentSnapshot_ = this_01;
      uVar20 = pVVar11->nBins2_;
      if ((ulong)uVar20 != 0) {
        uVar3 = (pVVar11->super_StaticAnalyser).nBins_;
        pvVar4 = (pVVar11->sliceSDLists_).
                 super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          if (uVar3 != 0) {
            lVar23 = *(long *)&pvVar4[uVar16].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            lVar17 = 0;
            do {
              if (*(long *)(lVar23 + 8 + lVar17) != *(long *)(lVar23 + lVar17)) {
                *(long *)(lVar23 + 8 + lVar17) = *(long *)(lVar23 + lVar17);
              }
              lVar17 = lVar17 + 0x18;
            } while ((ulong)uVar3 * 0x18 != lVar17);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar20);
      }
      Snapshot::getHmat(&local_12d0,this_01);
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)pVVar11->axis2_ * 0x20);
      __position._M_current =
           (pVVar11->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pVVar11->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f0,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (pVVar11->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1308 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)pVVar11->axis1_ * 0x20) * 0.5;
      local_1310 = (pointer)(*(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)pVVar11->axis2_ * 0x20) * 0.5);
      if ((pVVar11->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1338,local_12e8);
        lVar23 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((pVVar11->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar23),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1338.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar23));
          lVar23 = lVar23 + 0x28;
        } while (lVar23 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1338.bitsets_);
      }
      local_1300 = SelectionManager::beginSelected(this_02,&local_133c);
      while (local_1300 != (StuntDouble *)0x0) {
        pSVar13 = (SelectionSet *)
                  ((long)local_1300->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1300->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1300->storage_)
                  );
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar13 != &local_1338) {
          lVar23 = 0;
          do {
            (&local_1338.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar23] =
                 (&(pSVar13->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar23];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(pVVar11->currentSnapshot_,(Vector3d *)&local_1338);
        }
        pSVar13 = (SelectionSet *)
                  ((long)local_1300->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1300->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1300->storage_)
                  );
        if (pSVar13 != &local_1338) {
          lVar23 = 0;
          do {
            (&(pSVar13->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar23] =
                 (&local_1338.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar23];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
        }
        local_1300 = SelectionManager::nextSelected(this_02,&local_133c);
      }
      local_1300 = SelectionManager::beginSelected(this_02,&local_133c);
      while (local_1300 != (StuntDouble *)0x0) {
        lVar23 = *(long *)((long)&(local_1300->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1300->storage_);
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar23 + 0x10 + (long)local_1300->localIndex_ * 0x18);
        plVar1 = (long *)(lVar23 + (long)local_1300->localIndex_ * 0x18);
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar1;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar1[1];
        this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  (*(long *)&(pVVar11->sliceSDLists_).
                             super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(int)((((double)(&local_1338.bitsets_.
                                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                ._M_impl.super__Vector_impl_data._M_start)
                                              [(uint)pVVar11->axis2_] + (double)local_1310) *
                                    (double)pVVar11->nBins2_) /
                                   *(double *)
                                    ((long)local_12d0.super_SquareMatrix<double,_3>.
                                           super_RectMatrix<double,_3U,_3U>.data_ +
                                    (ulong)(uint)pVVar11->axis2_ * 0x20))].
                             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                             ._M_impl.super__Vector_impl_data +
                  (long)(int)((((double)(&local_1338.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start)
                                        [(uint)pVVar11->axis1_] + local_1308) *
                              (double)(pVVar11->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)pVVar11->axis1_ * 0x20)) * 0x18);
        __position_00._M_current = *(StuntDouble ***)(this_00 + 8);
        if (__position_00._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position_00,&local_1300);
        }
        else {
          *__position_00._M_current = local_1300;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        local_1300 = SelectionManager::nextSelected(this_02,&local_133c);
      }
      local_12d8 = uVar21;
      local_1308 = (double)(ulong)pVVar11->nBins2_;
      if (local_1308 != 0.0) {
        uVar16 = (ulong)(local_1318->super_StaticAnalyser).nBins_;
        local_1310 = (local_1318->sliceSDLists_).
                     super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = 0;
        do {
          if (uVar16 != 0) {
            lVar23 = *(long *)&local_1310[uVar15].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            uVar20 = local_1318->axis3_;
            pvVar5 = (local_1318->velocity_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar18 = 0;
            do {
              lVar17 = *(long *)(lVar23 + uVar18 * 0x18);
              lVar6 = *(long *)(lVar23 + 8 + uVar18 * 0x18);
              uVar22 = lVar6 - lVar17 >> 3;
              if (lVar6 == lVar17) {
                dVar10 = 0.0;
              }
              else {
                dVar10 = 0.0;
                uVar14 = 0;
                uVar19 = 1;
                do {
                  lVar7 = *(long *)(*(long *)(*(long *)&local_1310[uVar15].
                                                                                                                
                                                  super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar18 * 0x18)
                                   + uVar14 * 8);
                  lVar8 = *(long *)(*(long *)(*(long *)(lVar7 + 0x18) + 0x18) + 0x18 +
                                   *(long *)(lVar7 + 0x10));
                  local_1338.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       *(pointer *)(lVar8 + 0x10 + (long)*(int *)(lVar7 + 0x30) * 0x18);
                  plVar1 = (long *)(lVar8 + (long)*(int *)(lVar7 + 0x30) * 0x18);
                  local_1338.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                  local_1338.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar1[1];
                  dVar10 = dVar10 + (double)(&local_1338.bitsets_.
                                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                              ._M_impl.super__Vector_impl_data._M_start)[uVar20];
                  bVar9 = uVar19 < uVar22;
                  uVar14 = uVar19;
                  uVar19 = (ulong)((int)uVar19 + 1);
                } while (bVar9);
              }
              if (lVar6 != lVar17) {
                auVar24._8_4_ = (int)(lVar6 - lVar17 >> 0x23);
                auVar24._0_8_ = uVar22;
                auVar24._12_4_ = 0x45300000;
                lVar17 = *(long *)&pvVar5[uVar15].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar17 + uVar18 * 8) =
                     dVar10 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0)) +
                     *(double *)(lVar17 + uVar18 * 8);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar16);
          }
          uVar15 = uVar15 + 1;
        } while ((double)uVar15 != local_1308);
      }
      uVar20 = (int)uVar21 + (local_1318->super_StaticAnalyser).step_;
      uVar21 = (ulong)uVar20;
      this = local_1318;
    } while ((int)uVar20 < local_12f4);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void VelocityZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();

      zBox_.push_back(hmat(axis2_, axis2_));

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins2_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo2][binNo1].push_back(sd);
      }

      // loop over the slices to calculate the velocities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalVelocity = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalVelocity += sliceSDLists_[i][j][k]->getVel()[axis3_];
          }

          if (sliceSDLists_[i][j].size() > 0)
            velocity_[i][j] += totalVelocity / sliceSDLists_[i][j].size();
        }
      }
    }

    writeVelocity();
  }